

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O0

void qpCrashHandler_writeCrashInfo
               (qpCrashHandler *crashHandler,qpWriteCrashInfoFunc writeInfo,void *userPtr)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  __off_t _Var6;
  ssize_t sVar7;
  char local_261;
  int ret;
  char c;
  size_t symbolNameLength;
  char nameBuffer [256];
  int local_150;
  int symbolNdx;
  int symbolCount;
  void *symbols [32];
  int local_3c;
  char acStack_38 [4];
  int tmpFile;
  char tmpFileName [17];
  void *userPtr_local;
  qpWriteCrashInfoFunc writeInfo_local;
  qpCrashHandler *crashHandler_local;
  
  unique0x100002ff = userPtr;
  qpCrashInfo_write(&crashHandler->crashInfo,writeInfo,userPtr);
  builtin_strncpy(acStack_38,"back",4);
  tmpFile._0_1_ = 't';
  tmpFile._1_1_ = 'r';
  tmpFile._2_1_ = 'a';
  tmpFile._3_1_ = 'c';
  builtin_strncpy(tmpFileName,"e-XXXXXX",9);
  local_3c = mkstemp(acStack_38);
  pvVar1 = stack0xffffffffffffffe0;
  if (local_3c == -1) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    writeInfoFormat(writeInfo,pvVar1,"Failed to create tmpfile \'%s\' for the backtrace %s.",
                    acStack_38,pcVar5);
  }
  else {
    remove(acStack_38);
    iVar2 = backtrace(&symbolNdx,0x20);
    backtrace_symbols_fd(&symbolNdx,iVar2,local_3c);
    _Var6 = lseek(local_3c,0,0);
    pvVar1 = stack0xffffffffffffffe0;
    if (_Var6 < 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      writeInfoFormat(writeInfo,pvVar1,"Failed to seek to the beginning of the trace file %s.",
                      pcVar5);
      close(local_3c);
    }
    else {
      for (local_150 = 0; local_150 < iVar2; local_150 = local_150 + 1) {
        _ret = 0;
        iVar3 = snprintf((char *)&symbolNameLength,0x100,"0x%016lX : ",
                         *(undefined8 *)(&symbolNdx + (long)local_150 * 2));
        if (iVar3 < 0) {
          writeInfoFormat(writeInfo,stack0xffffffffffffffe0,"Failed to print symbol pointer.");
          _ret = 0;
        }
        else if (iVar3 < 0x100) {
          _ret = (long)iVar3;
        }
        else {
          _ret = 0xff;
          nameBuffer[0xf7] = '\0';
        }
        while (sVar7 = read(local_3c,&local_261,1), sVar7 == 1) {
          if (local_261 == '\n') {
            nameBuffer[_ret + -8] = '\0';
            (*writeInfo)(stack0xffffffffffffffe0,(char *)&symbolNameLength);
            goto LAB_029a16f8;
          }
          if (_ret + 1U < 0x100) {
            nameBuffer[_ret + -8] = local_261;
            _ret = _ret + 1;
          }
        }
        nameBuffer[_ret + -8] = '\0';
        (*writeInfo)(stack0xffffffffffffffe0,(char *)&symbolNameLength);
        writeInfoFormat(writeInfo,stack0xffffffffffffffe0,
                        "Unexpected EOF reading backtrace file \'%s\'",acStack_38);
        close(local_3c);
        local_3c = -1;
LAB_029a16f8:
        if (local_3c == -1) break;
      }
      if (local_3c != -1) {
        close(local_3c);
      }
    }
  }
  return;
}

Assistant:

void qpCrashHandler_writeCrashInfo (qpCrashHandler* crashHandler, qpWriteCrashInfoFunc writeInfo, void* userPtr)
{
	qpCrashInfo_write(&crashHandler->crashInfo, writeInfo, userPtr);

#if (DE_OS == DE_OS_UNIX)
	{
		char	tmpFileName[]	= "backtrace-XXXXXX";
		int		tmpFile			= mkstemp(tmpFileName);

		if (tmpFile == -1)
		{
			writeInfoFormat(writeInfo, userPtr, "Failed to create tmpfile '%s' for the backtrace %s.", tmpFileName, strerror(errno));
			return;
		}
		else
		{
			void*	symbols[32];
			int		symbolCount;
			int		symbolNdx;

			/* Remove file from filesystem. */
			remove(tmpFileName);

			symbolCount = backtrace(symbols, DE_LENGTH_OF_ARRAY(symbols));
			backtrace_symbols_fd(symbols, symbolCount, tmpFile);

			if (lseek(tmpFile, 0, SEEK_SET) < 0)
			{
				writeInfoFormat(writeInfo, userPtr, "Failed to seek to the beginning of the trace file %s.", strerror(errno));
				close(tmpFile);
				return;
			}

			for (symbolNdx = 0; symbolNdx < symbolCount; symbolNdx++)
			{
				char	nameBuffer[256];
				size_t	symbolNameLength = 0;
				char	c;

				{
					const int ret = snprintf(nameBuffer, DE_LENGTH_OF_ARRAY(nameBuffer), PTR_FMT  PRIXPTR " : ", (uintptr_t)symbols[symbolNdx]);

					if (ret < 0)
					{
						writeInfoFormat(writeInfo, userPtr, "Failed to print symbol pointer.");
						symbolNameLength = 0;
					}
					else if (ret >= DE_LENGTH_OF_ARRAY(nameBuffer))
					{
						symbolNameLength = DE_LENGTH_OF_ARRAY(nameBuffer) - 1;
						nameBuffer[DE_LENGTH_OF_ARRAY(nameBuffer) - 1] = '\0';
					}
					else
						symbolNameLength = ret;
				}

				for (;;)
				{
					if (read(tmpFile, &c, 1) == 1)
					{
						if (c == '\n')
						{
							/* Flush nameBuffer and move to next symbol. */
							nameBuffer[symbolNameLength] = '\0';
							writeInfo(userPtr, nameBuffer);
							break;
						}
						else
						{
							/* Add character to buffer if there is still space left. */
							if (symbolNameLength+1 < DE_LENGTH_OF_ARRAY(nameBuffer))
							{
								nameBuffer[symbolNameLength] = c;
								symbolNameLength++;
							}
						}
					}
					else
					{
						/* Flush nameBuffer. */
						nameBuffer[symbolNameLength] = '\0';
						writeInfo(userPtr, nameBuffer);

						/* Temp file ended unexpectedly? */
						writeInfoFormat(writeInfo, userPtr, "Unexpected EOF reading backtrace file '%s'", tmpFileName);
						close(tmpFile);
						tmpFile = -1;

						break;
					}
				}

				if (tmpFile == -1)
					break;
			}

			if (tmpFile != -1)
				close(tmpFile);
		}
	}
#endif
}